

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_table_entry.cpp
# Opt level: O3

unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> __thiscall
duckdb::DuckTableEntry::RemoveColumn
          (DuckTableEntry *this,ClientContext *context,RemoveColumnInfo *info)

{
  __node_base *__ht;
  size_type *this_00;
  SchemaCatalogEntry *pSVar1;
  pointer pCVar2;
  Catalog *pCVar3;
  bool bVar4;
  bool bVar5;
  LogicalIndex index;
  CreateTableInfo *this_01;
  pointer pCVar6;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_02;
  __node_base_ptr p_Var7;
  ColumnDefinition *pCVar8;
  LogicalIndex LVar9;
  size_type sVar10;
  Binder *pBVar11;
  type create_info_00;
  type pBVar12;
  DuckTableEntry *pDVar13;
  type __args_1;
  CatalogException *pCVar14;
  RemoveColumnInfo *in_RCX;
  pointer pLVar15;
  __hash_code __code;
  ColumnListIterator CVar16;
  templated_unique_single_t create_info;
  vector<duckdb::LogicalIndex,_true> adjusted_indices;
  shared_ptr<duckdb::DataTable,_true> new_storage;
  shared_ptr<duckdb::Binder,_true> binder;
  logical_index_set_t removed_columns;
  vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
  bound_constraints;
  LogicalIndex removed_index;
  _Head_base<0UL,_duckdb::CreateTableInfo_*,_false> local_210;
  undefined1 local_201;
  undefined1 local_200 [8];
  undefined1 local_1f8 [32];
  shared_ptr<duckdb::DataTable,_true> local_1d8;
  undefined1 local_1c8 [24];
  _Head_base<0UL,_duckdb::CatalogEntry_*,_false> local_1b0;
  _Alloc_hider local_1a8;
  __node_base local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [32];
  undefined1 auStack_148 [48];
  LogicalIndex local_118;
  __node_base local_110;
  undefined1 local_108 [216];
  
  local_1a0._M_nxt = (_Hash_node_base *)info;
  index = TableCatalogEntry::GetColumnIndex
                    ((TableCatalogEntry *)context,&in_RCX->removed_column,in_RCX->if_column_exists);
  local_118 = index;
  if (index.index == 0xffffffffffffffff) {
    if (in_RCX->if_column_exists == false) {
      pCVar14 = (CatalogException *)__cxa_allocate_exception(0x10);
      local_178._0_8_ = local_178 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_178,"Cannot drop column: rowid column cannot be dropped","");
      CatalogException::CatalogException(pCVar14,(string *)local_178);
      __cxa_throw(pCVar14,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
    }
    (this->super_TableCatalogEntry).super_StandardEntry.super_InCatalogEntry.super_CatalogEntry.
    _vptr_CatalogEntry = (_func_int **)0x0;
  }
  else {
    pSVar1 = *(SchemaCatalogEntry **)&(context->config).query_verification_enabled;
    local_1b0._M_head_impl = (CatalogEntry *)this;
    local_1a8._M_p = (pointer)in_RCX;
    this_01 = (CreateTableInfo *)operator_new(0x1d8);
    local_178._0_8_ = (ClientContext *)(local_178 + 0x10);
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_178,*(long *)&context->interrupted,
               (long)&(((context->registered_state).
                        super_unique_ptr<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
                        ._M_t.
                        super___uniq_ptr_impl<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
                        .super__Head_base<0UL,_duckdb::RegisteredStateManager_*,_false>._M_head_impl
                       )->lock).super___mutex_base._M_mutex + *(long *)&context->interrupted);
    CreateTableInfo::CreateTableInfo(this_01,pSVar1,(string *)local_178);
    local_210._M_head_impl = this_01;
    if ((ClientContext *)local_178._0_8_ != (ClientContext *)(local_178 + 0x10)) {
      operator_delete((void *)local_178._0_8_);
    }
    bVar4 = *(bool *)((long)&(context->config).home_directory._M_string_length + 1);
    pCVar6 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
             ::operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                           *)&local_210);
    (pCVar6->super_CreateInfo).temporary = bVar4;
    pCVar6 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
             ::operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                           *)&local_210);
    Value::operator=(&(pCVar6->super_CreateInfo).comment,
                     (Value *)((long)&(context->config).home_directory.field_2 + 8));
    pCVar6 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
             ::operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                           *)&local_210);
    __ht = &(context->config).profiler_settings._M_h._M_before_begin;
    this_02 = &(pCVar6->super_CreateInfo).tags;
    if ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)__ht != this_02) {
      ::std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)this_02,
                 (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)__ht);
    }
    local_178._0_8_ = auStack_148;
    local_178._8_8_ = &DAT_00000001;
    local_168._0_8_ = (_Hash_node_base *)0x0;
    local_168._8_8_ = (_Hash_node_base *)0x0;
    local_168._16_4_ = 1.0;
    local_168._24_8_ = 0;
    auStack_148._0_8_ = (element_type *)0x0;
    this_00 = &(context->config).user_variables._M_h._M_element_count;
    bVar4 = ColumnDependencyManager::HasDependents((ColumnDependencyManager *)this_00,index);
    if (bVar4) {
      local_1f8._0_8_ = index;
      p_Var7 = ::std::
               _Hashtable<duckdb::LogicalIndex,_std::pair<const_duckdb::LogicalIndex,_std::unordered_set<duckdb::LogicalIndex,_duckdb::LogicalIndexHashFunction,_std::equal_to<duckdb::LogicalIndex>,_std::allocator<duckdb::LogicalIndex>_>_>,_std::allocator<std::pair<const_duckdb::LogicalIndex,_std::unordered_set<duckdb::LogicalIndex,_duckdb::LogicalIndexHashFunction,_std::equal_to<duckdb::LogicalIndex>,_std::allocator<duckdb::LogicalIndex>_>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::_M_find_before_node
                         ((_Hashtable<duckdb::LogicalIndex,_std::pair<const_duckdb::LogicalIndex,_std::unordered_set<duckdb::LogicalIndex,_duckdb::LogicalIndexHashFunction,_std::equal_to<duckdb::LogicalIndex>,_std::allocator<duckdb::LogicalIndex>_>_>,_std::allocator<std::pair<const_duckdb::LogicalIndex,_std::unordered_set<duckdb::LogicalIndex,_duckdb::LogicalIndexHashFunction,_std::equal_to<duckdb::LogicalIndex>,_std::allocator<duckdb::LogicalIndex>_>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)this_00,
                          index.index %
                          *(ulong *)&(context->config).user_variables._M_h._M_rehash_policy,
                          (key_type *)local_1f8,index.index);
      if ((_Hashtable<duckdb::LogicalIndex,_duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
           *)(p_Var7->_M_nxt + 2) !=
          (_Hashtable<duckdb::LogicalIndex,_duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
           *)local_178) {
        ::std::
        _Hashtable<duckdb::LogicalIndex,duckdb::LogicalIndex,std::allocator<duckdb::LogicalIndex>,std::__detail::_Identity,std::equal_to<duckdb::LogicalIndex>,duckdb::LogicalIndexHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_assign_elements<std::_Hashtable<duckdb::LogicalIndex,duckdb::LogicalIndex,std::allocator<duckdb::LogicalIndex>,std::__detail::_Identity,std::equal_to<duckdb::LogicalIndex>,duckdb::LogicalIndexHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
                  ((_Hashtable<duckdb::LogicalIndex,duckdb::LogicalIndex,std::allocator<duckdb::LogicalIndex>,std::__detail::_Identity,std::equal_to<duckdb::LogicalIndex>,duckdb::LogicalIndexHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)local_178,
                   (_Hashtable<duckdb::LogicalIndex,_duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    *)(p_Var7->_M_nxt + 2));
      }
    }
    if (((_Hash_node_base *)local_168._8_8_ != (_Hash_node_base *)0x0) &&
       ((bool)local_1a8._M_p[0x99] == false)) {
      pCVar14 = (CatalogException *)__cxa_allocate_exception(0x10);
      local_1f8._0_8_ = local_1f8 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1f8,
                 "Cannot drop column: column is a dependency of 1 or more generated column(s)","");
      CatalogException::CatalogException(pCVar14,(string *)local_1f8);
      __cxa_throw(pCVar14,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_1c8._8_8_ = &(context->config).asof_loop_join_threshold;
    CVar16 = ColumnList::Logical((ColumnList *)local_1c8._8_8_);
    local_1f8._0_8_ = CVar16.list;
    local_1f8[8] = CVar16.physical;
    if (((undefined1  [16])CVar16 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      pCVar2 = (((ColumnList *)local_1f8._0_8_)->columns).
               super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
               super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_1f8._24_8_ =
           ((long)pCVar2 -
            (long)(((ColumnList *)local_1f8._0_8_)->columns).
                  super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
                  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed;
      pLVar15 = (pointer)(((long)pCVar2 -
                           (long)(((ColumnList *)local_1f8._0_8_)->columns).
                                 super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                                 .
                                 super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3) *
                         -0x7b425ed097b425ed);
    }
    else {
      pLVar15 = (pointer)((long)(((ColumnList *)local_1f8._0_8_)->physical_columns).
                                super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)(((ColumnList *)local_1f8._0_8_)->physical_columns).
                                super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 3);
      local_1f8._24_8_ = pLVar15;
    }
    local_1f8._16_8_ = (pointer)0x0;
    auStack_148._8_8_ = &context->interrupted;
    bVar4 = false;
    local_1c8._16_8_ = local_1f8._0_8_;
    auStack_148._16_8_ = this_00;
    while ((((pointer)local_1f8._16_8_ != pLVar15 || ((pointer)local_1f8._24_8_ != pLVar15)) ||
           (local_1f8._0_8_ != local_1c8._16_8_))) {
      pCVar8 = ColumnList::ColumnListIterator::ColumnLogicalIteratorInternal::operator*
                         ((ColumnLogicalIteratorInternal *)local_1f8);
      LVar9 = ColumnDefinition::Logical(pCVar8);
      if (LVar9.index == index.index) {
LAB_00a864de:
        bVar5 = ColumnDefinition::Generated(pCVar8);
        bVar4 = (bool)(bVar4 | bVar5);
      }
      else {
        auStack_148._24_8_ = ColumnDefinition::Logical(pCVar8);
        sVar10 = ::std::
                 _Hashtable<duckdb::LogicalIndex,_duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 ::count((_Hashtable<duckdb::LogicalIndex,_duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                          *)local_178,(key_type *)(auStack_148 + 0x18));
        if (sVar10 != 0) goto LAB_00a864de;
        pCVar6 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                 ::operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                               *)&local_210);
        ColumnDefinition::Copy((ColumnDefinition *)local_108,pCVar8);
        ColumnList::AddColumn(&pCVar6->columns,(ColumnDefinition *)local_108);
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)(local_108 + 0xa0));
        Value::~Value((Value *)(local_108 + 0x60));
        if ((ParsedExpression *)local_108._88_8_ != (ParsedExpression *)0x0) {
          (*((BaseExpression *)local_108._88_8_)->_vptr_BaseExpression[1])();
        }
        local_108._88_8_ =
             (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
              )0x0;
        LogicalType::~LogicalType((LogicalType *)(local_108 + 0x20));
        if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
          operator_delete((void *)local_108._0_8_);
        }
      }
      local_1f8._16_8_ = local_1f8._16_8_ + 1;
    }
    pCVar6 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
             ::operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                           *)&local_210);
    if ((pCVar6->columns).columns.
        super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
        super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        (pCVar6->columns).columns.
        super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
        super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      pCVar14 = (CatalogException *)__cxa_allocate_exception(0x10);
      local_1f8._0_8_ = local_1f8 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1f8,"Cannot drop column: table only has one column remaining!","");
      CatalogException::CatalogException(pCVar14,(string *)local_1f8);
      __cxa_throw(pCVar14,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
    }
    ColumnDependencyManager::RemoveColumn
              ((vector<duckdb::LogicalIndex,_true> *)local_1f8,
               (ColumnDependencyManager *)auStack_148._16_8_,index,
               ((long)((context->config).streaming_buffer_size -
                      (context->config).asof_loop_join_threshold) >> 3) * -0x7b425ed097b425ed);
    Binder::CreateBinder
              ((Binder *)local_188,(ClientContext *)local_1a0._M_nxt,
               (optional_ptr<duckdb::Binder,_true>)0x0,REGULAR_BINDER);
    pBVar11 = shared_ptr<duckdb::Binder,_true>::operator->
                        ((shared_ptr<duckdb::Binder,_true> *)local_188);
    Binder::BindConstraints
              ((vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
                *)(auStack_148 + 0x18),pBVar11,
               (vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
                *)&(context->config).set_variables._M_h._M_rehash_policy._M_next_resize,
               (string *)auStack_148._8_8_,(ColumnList *)local_1c8._8_8_);
    create_info_00 =
         unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
         operator*((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                    *)&local_210);
    UpdateConstraintsOnColumnDrop
              ((DuckTableEntry *)context,&local_118,(vector<duckdb::LogicalIndex,_true> *)local_1f8,
               (RemoveColumnInfo *)local_1a8._M_p,create_info_00,
               (vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
                *)(auStack_148 + 0x18),bVar4);
    pBVar11 = shared_ptr<duckdb::Binder,_true>::operator->
                        ((shared_ptr<duckdb::Binder,_true> *)local_188);
    local_1c8._0_8_ = local_210._M_head_impl;
    local_210._M_head_impl = (CreateTableInfo *)0x0;
    Binder::BindCreateTableInfo
              ((Binder *)local_200,
               (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)
               pBVar11,(SchemaCatalogEntry *)local_1c8);
    if ((CreateTableInfo *)local_1c8._0_8_ != (CreateTableInfo *)0x0) {
      (*(((CreateInfo *)local_1c8._0_8_)->super_ParseInfo)._vptr_ParseInfo[1])();
    }
    local_1c8._0_8_ = (_func_int **)0x0;
    pCVar8 = ColumnList::GetColumn((ColumnList *)local_1c8._8_8_,index);
    bVar4 = ColumnDefinition::Generated(pCVar8);
    if (bVar4) {
      pCVar3 = (Catalog *)(context->config).max_expression_depth;
      pSVar1 = *(SchemaCatalogEntry **)&(context->config).query_verification_enabled;
      pBVar12 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                ::operator*((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                             *)local_200);
      pDVar13 = (DuckTableEntry *)operator_new(0x298);
      local_1d8.internal.super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)(context->config).user_variables._M_h._M_bucket_count;
      local_1d8.internal.super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           (context->config).user_variables._M_h._M_before_begin._M_nxt;
      if (local_1d8.internal.super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_1d8.internal.super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_1d8.internal.super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_1d8.internal.super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_1d8.internal.super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      DuckTableEntry(pDVar13,pCVar3,pSVar1,pBVar12,&local_1d8);
      if (local_1d8.internal.super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1d8.internal.
                   super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      (local_1b0._M_head_impl)->_vptr_CatalogEntry = (_func_int **)pDVar13;
      this = (DuckTableEntry *)local_1b0._M_head_impl;
    }
    else {
      __args_1 = shared_ptr<duckdb::DataTable,_true>::operator*
                           ((shared_ptr<duckdb::DataTable,_true> *)
                            &(context->config).user_variables._M_h._M_bucket_count);
      local_110._M_nxt =
           (_Hash_node_base *)ColumnList::LogicalToPhysical((ColumnList *)local_1c8._8_8_,index);
      local_1d8.internal.super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<duckdb::DataTable,std::allocator<duckdb::DataTable>,duckdb::ClientContext&,duckdb::DataTable&,unsigned_long>
                (&local_1d8.internal.
                  super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (DataTable **)&local_1d8,(allocator<duckdb::DataTable> *)&local_201,
                 (ClientContext *)local_1a0._M_nxt,__args_1,(unsigned_long *)&local_110);
      shared_ptr<duckdb::DataTable,_true>::shared_ptr
                ((shared_ptr<duckdb::DataTable,_true> *)&local_198,&local_1d8.internal);
      if (local_1d8.internal.super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1d8.internal.
                   super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      pCVar3 = (Catalog *)(context->config).max_expression_depth;
      pSVar1 = *(SchemaCatalogEntry **)&(context->config).query_verification_enabled;
      pBVar12 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                ::operator*((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                             *)local_200);
      pDVar13 = (DuckTableEntry *)operator_new(0x298);
      local_1d8.internal.super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_198._M_allocated_capacity;
      local_1d8.internal.super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_198._8_8_ + 8) = *(_Atomic_word *)(local_198._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_198._8_8_ + 8) = *(_Atomic_word *)(local_198._8_8_ + 8) + 1;
        }
      }
      DuckTableEntry(pDVar13,pCVar3,pSVar1,pBVar12,&local_1d8);
      if (local_1d8.internal.super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1d8.internal.
                   super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      this = (DuckTableEntry *)local_1b0;
      (local_1b0._M_head_impl)->_vptr_CatalogEntry = (_func_int **)pDVar13;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_);
      }
    }
    if ((_Tuple_impl<0UL,_duckdb::BoundCreateTableInfo_*,_std::default_delete<duckdb::BoundCreateTableInfo>_>
         )local_200 != (BoundCreateTableInfo *)0x0) {
      ::std::default_delete<duckdb::BoundCreateTableInfo>::operator()
                ((default_delete<duckdb::BoundCreateTableInfo> *)local_200,
                 (BoundCreateTableInfo *)local_200);
    }
    ::std::
    vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
               *)(auStack_148 + 0x18));
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_);
    }
    if ((ColumnList *)local_1f8._0_8_ != (ColumnList *)0x0) {
      operator_delete((void *)local_1f8._0_8_);
    }
    ::std::
    _Hashtable<duckdb::LogicalIndex,_duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<duckdb::LogicalIndex,_duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)local_178);
    if (local_210._M_head_impl != (CreateTableInfo *)0x0) {
      (*((local_210._M_head_impl)->super_CreateInfo).super_ParseInfo._vptr_ParseInfo[1])();
    }
  }
  return (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)
         (_Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>)this;
}

Assistant:

unique_ptr<CatalogEntry> DuckTableEntry::RemoveColumn(ClientContext &context, RemoveColumnInfo &info) {
	auto removed_index = GetColumnIndex(info.removed_column, info.if_column_exists);
	if (!removed_index.IsValid()) {
		if (!info.if_column_exists) {
			throw CatalogException("Cannot drop column: rowid column cannot be dropped");
		}
		return nullptr;
	}

	auto create_info = make_uniq<CreateTableInfo>(schema, name);
	create_info->temporary = temporary;
	create_info->comment = comment;
	create_info->tags = tags;

	logical_index_set_t removed_columns;
	if (column_dependency_manager.HasDependents(removed_index)) {
		removed_columns = column_dependency_manager.GetDependents(removed_index);
	}
	if (!removed_columns.empty() && !info.cascade) {
		throw CatalogException("Cannot drop column: column is a dependency of 1 or more generated column(s)");
	}
	bool dropped_column_is_generated = false;
	for (auto &col : columns.Logical()) {
		if (col.Logical() == removed_index || removed_columns.count(col.Logical())) {
			if (col.Generated()) {
				dropped_column_is_generated = true;
			}
			continue;
		}
		create_info->columns.AddColumn(col.Copy());
	}
	if (create_info->columns.empty()) {
		throw CatalogException("Cannot drop column: table only has one column remaining!");
	}
	auto adjusted_indices = column_dependency_manager.RemoveColumn(removed_index, columns.LogicalColumnCount());

	auto binder = Binder::CreateBinder(context);
	auto bound_constraints = binder->BindConstraints(constraints, name, columns);

	UpdateConstraintsOnColumnDrop(removed_index, adjusted_indices, info, *create_info, bound_constraints,
	                              dropped_column_is_generated);

	auto bound_create_info = binder->BindCreateTableInfo(std::move(create_info), schema);
	if (columns.GetColumn(LogicalIndex(removed_index)).Generated()) {
		return make_uniq<DuckTableEntry>(catalog, schema, *bound_create_info, storage);
	}
	auto new_storage =
	    make_shared_ptr<DataTable>(context, *storage, columns.LogicalToPhysical(LogicalIndex(removed_index)).index);
	return make_uniq<DuckTableEntry>(catalog, schema, *bound_create_info, new_storage);
}